

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void rankStepFunc(sqlite3_context *pCtx,int nArg,sqlite3_value **apArg)

{
  long lVar1;
  long *plVar2;
  
  if ((short)pCtx->pMem->flags < 0) {
    plVar2 = (long *)pCtx->pMem->z;
  }
  else {
    plVar2 = (long *)createAggContext(pCtx,0x18);
  }
  if (plVar2 != (long *)0x0) {
    lVar1 = plVar2[1];
    plVar2[1] = lVar1 + 1;
    if (*plVar2 == 0) {
      *plVar2 = lVar1 + 1;
    }
  }
  return;
}

Assistant:

static void rankStepFunc(
  sqlite3_context *pCtx,
  int nArg,
  sqlite3_value **apArg
){
  struct CallCount *p;
  p = (struct CallCount*)sqlite3_aggregate_context(pCtx, sizeof(*p));
  if( p ){
    p->nStep++;
    if( p->nValue==0 ){
      p->nValue = p->nStep;
    }
  }
  UNUSED_PARAMETER(nArg);
  UNUSED_PARAMETER(apArg);
}